

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::
class_<std::vector<long,_std::allocator<long>_>,_std::unique_ptr<std::vector<long,_std::allocator<long>_>,_std::default_delete<std::vector<long,_std::allocator<long>_>_>_>_>
::class_<pybind11::module_local>
          (class_<std::vector<long,_std::allocator<long>_>,_std::unique_ptr<std::vector<long,_std::allocator<long>_>,_std::default_delete<std::vector<long,_std::allocator<long>_>_>_>_>
           *this,handle scope,char *name,module_local *extra)

{
  type_record record;
  type_record local_88;
  
  (this->super_generic_type).super_object.super_handle.m_ptr = (PyObject *)0x0;
  detail::type_record::type_record(&local_88);
  local_88.type = (type_info *)&std::vector<long,std::allocator<long>>::typeinfo;
  local_88.type_size = 0x18;
  local_88.type_align = 8;
  local_88.holder_size = 8;
  local_88.init_instance = init_instance;
  local_88.dealloc = dealloc;
  local_88._96_1_ = local_88._96_1_ & 0xef | 8 | extra->value << 4;
  local_88.scope.m_ptr = scope.m_ptr;
  local_88.name = name;
  detail::generic_type::initialize(&this->super_generic_type,&local_88);
  object::~object(&local_88.bases.super_object);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
            (   constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                constexpr_sum(is_base<options>::value...)   == 0 && // no template option bases
                none_of<std::is_same<multiple_inheritance, Extra>...>::value), // no multiple_inheritance attr
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.type_align = alignof(conditional_t<has_alias, type_alias, type>&);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = detail::is_instantiation<std::unique_ptr, holder_type>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? registered_local_types_cpp() : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }